

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlAssignRandomFrame(Ssw_Sml_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if (p->nFrames <= iFrame) {
    __assert_fail("iFrame < p->nFrames",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                  ,0x21e,"void Ssw_SmlAssignRandomFrame(Ssw_Sml_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) == 2) {
    iVar1 = p->nWordsFrame;
    if (0 < iVar1) {
      iVar2 = p->nWordsTotal;
      iVar3 = pObj->Id;
      lVar5 = 0;
      do {
        uVar4 = Aig_ManRandom(0);
        *(uint *)((long)&p[1].pAig +
                 lVar5 * 4 + (long)(iVar1 * iFrame) * 4 + (long)(iVar2 * iVar3) * 4) = uVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 < p->nWordsFrame);
    }
    return;
  }
  __assert_fail("Aig_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswSim.c"
                ,0x21f,"void Ssw_SmlAssignRandomFrame(Ssw_Sml_t *, Aig_Obj_t *, int)");
}

Assistant:

void Ssw_SmlAssignRandomFrame( Ssw_Sml_t * p, Aig_Obj_t * pObj, int iFrame )
{
    unsigned * pSims;
    int i;
    assert( iFrame < p->nFrames );
    assert( Aig_ObjIsCi(pObj) );
    pSims = Ssw_ObjSim( p, pObj->Id ) + p->nWordsFrame * iFrame;
    for ( i = 0; i < p->nWordsFrame; i++ )
        pSims[i] = Ssw_ObjRandomSim();
}